

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O0

size_t __thiscall vox::nSHP::getSize(nSHP *this)

{
  reference this_00;
  size_t sVar1;
  int local_1c;
  size_t sStack_18;
  int i;
  size_t s;
  nSHP *this_local;
  
  sStack_18 = DICT::getSize(&this->nodeAttribs);
  sStack_18 = sStack_18 + 8;
  for (local_1c = 0; local_1c < this->numModels; local_1c = local_1c + 1) {
    this_00 = std::vector<vox::MODEL,_std::allocator<vox::MODEL>_>::operator[]
                        (&this->models,(long)local_1c);
    sVar1 = MODEL::getSize(this_00);
    sStack_18 = sVar1 + sStack_18;
  }
  return sStack_18;
}

Assistant:

size_t nSHP::getSize() {
    size_t s = sizeof(int32_t) * 2 + nodeAttribs.getSize();
    for (int i = 0; i < numModels; i++)
        s += models[i].getSize();
    return s;
}